

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpc.c
# Opt level: O3

void mpc_input_delete(mpc_input_t *i)

{
  int iVar1;
  
  free(i->filename);
  iVar1 = i->type;
  if (iVar1 == 0) {
    free(i->string);
    iVar1 = i->type;
  }
  if (iVar1 == 2) {
    free(i->buffer);
  }
  free(i->marks);
  free(i->lasts);
  free(i);
  return;
}

Assistant:

static void mpc_input_delete(mpc_input_t *i) {

  free(i->filename);

  if (i->type == MPC_INPUT_STRING) { free(i->string); }
  if (i->type == MPC_INPUT_PIPE) { free(i->buffer); }

  free(i->marks);
  free(i->lasts);
  free(i);
}